

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int64_t absl::ToUnixMillis(Time t)

{
  uint32_t uVar1;
  int64_t iVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  uint uVar4;
  time_internal *this;
  Duration DVar5;
  Duration DVar6;
  Time t_00;
  Time t_01;
  Time t_02;
  Time t_03;
  Duration d;
  Time t_04;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  Time t_local;
  
  this = (time_internal *)t.rep_.rep_hi_;
  uVar4 = t.rep_.rep_lo_;
  t_00.rep_._8_8_ = in_RDX;
  t_00.rep_.rep_hi_ = (ulong)uVar4;
  DVar5 = time_internal::ToUnixDuration(this,t_00);
  DVar6._12_4_ = 0;
  DVar6.rep_hi_ = SUB128(DVar5._0_12_,0);
  DVar6.rep_lo_ = SUB124(DVar5._0_12_,8);
  iVar2 = time_internal::GetRepHi(DVar6);
  uVar3 = extraout_RDX;
  if (-1 < iVar2) {
    t_01.rep_._8_8_ = extraout_RDX;
    t_01.rep_.rep_hi_ = (ulong)uVar4;
    DVar5 = time_internal::ToUnixDuration(this,t_01);
    d_00._12_4_ = 0;
    d_00.rep_hi_ = SUB128(DVar5._0_12_,0);
    d_00.rep_lo_ = SUB124(DVar5._0_12_,8);
    iVar2 = time_internal::GetRepHi(d_00);
    uVar3 = extraout_RDX_00;
    if (iVar2 >> 0x35 == 0) {
      t_02.rep_._8_8_ = extraout_RDX_00;
      t_02.rep_.rep_hi_ = (ulong)uVar4;
      DVar5 = time_internal::ToUnixDuration(this,t_02);
      d_01._12_4_ = 0;
      d_01.rep_hi_ = SUB128(DVar5._0_12_,0);
      d_01.rep_lo_ = SUB124(DVar5._0_12_,8);
      iVar2 = time_internal::GetRepHi(d_01);
      t_03.rep_._8_8_ = extraout_RDX_01;
      t_03.rep_.rep_hi_ = (ulong)uVar4;
      DVar5 = time_internal::ToUnixDuration(this,t_03);
      d._8_8_ = DVar5._8_8_;
      d.rep_hi_ = (ulong)DVar5.rep_lo_;
      uVar1 = time_internal::GetRepLo((time_internal *)DVar5.rep_hi_,d);
      return iVar2 * 1000 + (ulong)uVar1 / 4000000;
    }
  }
  t_04.rep_._8_8_ = uVar3;
  t_04.rep_.rep_hi_ = (ulong)uVar4;
  DVar5 = time_internal::ToUnixDuration(this,t_04);
  DVar6 = Milliseconds<int,_0>(1);
  d_02._12_4_ = 0;
  d_02.rep_hi_ = SUB128(DVar5._0_12_,0);
  d_02.rep_lo_ = SUB124(DVar5._0_12_,8);
  DVar5._12_4_ = 0;
  DVar5.rep_hi_ = SUB128(DVar6._0_12_,0);
  DVar5.rep_lo_ = SUB124(DVar6._0_12_,8);
  iVar2 = anon_unknown_8::FloorToUnit(d_02,DVar5);
  return iVar2;
}

Assistant:

int64_t ToUnixMillis(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 53 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) /
            (4000 * 1000));
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Milliseconds(1));
}